

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void setup_room(tgestate_t *state)

{
  char cVar1;
  room_t room_index;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  object_t oVar6;
  uint uVar7;
  uint uVar8;
  doorindex_t *pdVar9;
  door_t *pdVar10;
  char cVar11;
  char cVar12;
  long lVar13;
  byte bVar14;
  bool bVar15;
  
  cVar12 = '\0';
  memset(state->tile_buf,0,state->tile_buf_size);
  room_index = state->room_index;
  pdVar9 = state->interior_doors;
  state->interior_doors[0] = 0xff;
  state->interior_doors[1] = 0xff;
  state->interior_doors[2] = 0xff;
  state->interior_doors[3] = 0xff;
  pdVar10 = doors;
  cVar11 = -0x7c;
  do {
    if ((byte)(pdVar10->room_and_direction & 0xfc) == (byte)(room_index * '\x04')) {
      *pdVar9 = cVar12 + 0x80;
      pdVar9 = pdVar9 + 1;
    }
    cVar1 = cVar12 + -0x7f;
    bVar15 = cVar12 < '\0';
    cVar12 = cVar12 + -0x80;
    if (bVar15) {
      cVar12 = cVar1;
    }
    pdVar10 = pdVar10 + 1;
    cVar11 = cVar11 + '\x01';
  } while (cVar11 != '\0');
  iVar3 = get_roomdef(state,room_index,0);
  state->roomdef_dimensions_index = (uint8_t)iVar3;
  uVar4 = get_roomdef(state,room_index,1);
  state->roomdef_object_bounds_count = (uint8_t)uVar4;
  iVar3 = 2;
  if (((uint8_t)uVar4 != '\0') && ((uVar4 * 4 & 0x3fc) != 0)) {
    lVar13 = 0;
    do {
      iVar3 = get_roomdef(state,room_index,(int)lVar13 + 2);
      (&state->roomdef_object_bounds[0].x0)[lVar13] = (uint8_t)iVar3;
      lVar13 = lVar13 + 1;
    } while ((uVar4 & 0xff) << 2 != (int)lVar13);
    iVar3 = (int)lVar13 + 2;
  }
  iVar5 = get_roomdef(state,room_index,iVar3);
  uVar2 = (uint8_t)iVar5;
  state->interior_mask_data_count = uVar2;
  if (uVar2 != '\0') {
    lVar13 = 0;
    do {
      iVar3 = iVar3 + 1;
      uVar4 = get_roomdef(state,room_index,iVar3);
      state->interior_mask_data[lVar13] = setup_room::interior_mask_data_source[uVar4 & 0xff];
      lVar13 = lVar13 + 1;
    } while (uVar2 != (uint8_t)lVar13);
  }
  uVar4 = get_roomdef(state,room_index,iVar3 + 1);
  if ((char)uVar4 != '\0') {
    iVar3 = iVar3 + 2;
    do {
      oVar6 = get_roomdef(state,room_index,iVar3);
      uVar7 = get_roomdef(state,room_index,iVar3 + 1);
      uVar8 = get_roomdef(state,room_index,iVar3 + 2);
      expand_object(state,oVar6 & 0xff,
                    state->tile_buf + (int)((uVar7 & 0xff) + (uVar8 & 0xff) * state->columns));
      iVar3 = iVar3 + 3;
      bVar14 = (char)uVar4 - 1;
      uVar4 = (uint)bVar14;
    } while (bVar14 != 0);
  }
  return;
}

Assistant:

void setup_room(tgestate_t *state)
{
  /**
   * $EA7C: Interior masking data.
   *
   * Conv: Constant final (pos.height) byte added into this data.
   */
  static const mask_t interior_mask_data_source[47] =
  {
    { 27, { 123, 127, 241, 243 }, { 54, 40, 32 } },
    { 27, { 119, 123, 243, 245 }, { 54, 24, 32 } },
    { 27, { 124, 128, 241, 243 }, { 50, 42, 32 } },
    { 25, { 131, 134, 242, 247 }, { 24, 36, 32 } },
    { 25, { 129, 132, 244, 249 }, { 24, 26, 32 } },
    { 25, { 129, 132, 243, 248 }, { 28, 23, 32 } },
    { 25, { 131, 134, 244, 248 }, { 22, 32, 32 } },
    { 24, { 125, 128, 244, 249 }, { 24, 26, 32 } },
    { 24, { 123, 126, 243, 248 }, { 34, 26, 32 } },
    { 24, { 121, 124, 244, 249 }, { 34, 16, 32 } },
    { 24, { 123, 126, 244, 249 }, { 28, 23, 32 } },
    { 24, { 121, 124, 241, 246 }, { 44, 30, 32 } },
    { 24, { 125, 128, 242, 247 }, { 36, 34, 32 } },
    { 29, { 127, 130, 246, 247 }, { 28, 30, 32 } },
    { 29, { 130, 133, 242, 243 }, { 35, 48, 32 } },
    { 29, { 134, 137, 242, 243 }, { 28, 55, 32 } },
    { 29, { 134, 137, 244, 245 }, { 24, 48, 32 } },
    { 29, { 128, 131, 241, 242 }, { 40, 48, 32 } },
    { 28, { 129, 130, 244, 246 }, { 28, 32, 32 } },
    { 28, { 131, 132, 244, 246 }, { 28, 46, 32 } },
    { 26, { 126, 128, 245, 247 }, { 28, 32, 32 } },
    { 18, { 122, 123, 242, 243 }, { 58, 40, 32 } },
    { 18, { 122, 123, 239, 240 }, { 69, 53, 32 } },
    { 23, { 128, 133, 244, 246 }, { 28, 36, 32 } },
    { 20, { 128, 132, 243, 245 }, { 38, 40, 32 } },
    { 21, { 132, 133, 246, 247 }, { 26, 30, 32 } },
    { 21, { 126, 127, 243, 244 }, { 46, 38, 32 } },
    { 22, { 124, 133, 239, 243 }, { 50, 34, 32 } },
    { 22, { 121, 130, 240, 244 }, { 52, 26, 32 } },
    { 22, { 125, 134, 242, 246 }, { 36, 26, 32 } },
    { 16, { 118, 120, 245, 247 }, { 54, 10, 32 } },
    { 16, { 122, 124, 243, 245 }, { 54, 10, 32 } },
    { 16, { 126, 128, 241, 243 }, { 54, 10, 32 } },
    { 16, { 130, 132, 239, 241 }, { 54, 10, 32 } },
    { 16, { 134, 136, 237, 239 }, { 54, 10, 32 } },
    { 16, { 138, 140, 235, 237 }, { 54, 10, 32 } },
    { 17, { 115, 117, 235, 237 }, { 10, 48, 32 } },
    { 17, { 119, 121, 237, 239 }, { 10, 48, 32 } },
    { 17, { 123, 125, 239, 241 }, { 10, 48, 32 } },
    { 17, { 127, 129, 241, 243 }, { 10, 48, 32 } },
    { 17, { 131, 133, 243, 245 }, { 10, 48, 32 } },
    { 17, { 135, 137, 245, 247 }, { 10, 48, 32 } },
    { 16, { 132, 134, 244, 246 }, { 10, 48, 32 } }, /* BUG FIX: bound.y1 was 1 too high. */
    { 17, { 135, 137, 237, 239 }, { 10, 48, 32 } },
    { 17, { 123, 125, 243, 245 }, { 10, 10, 32 } },
    { 17, { 121, 123, 244, 246 }, { 10, 10, 32 } },
    { 15, { 136, 140, 245, 248 }, { 10, 10, 32 } },
  };

  /* Conv: Direct access to the room definition data has been removed and
   * replaced with calls to get_room_byte. */

  //const roomdef_t *proomdef; /* was HL */
  int              room_index;  /* Conv: Replaces direct access */
  int              offset;      /* Conv: Replaces direct access */
  bounds_t        *pbounds;  /* was DE */
  mask_t          *pmask;    /* was DE */
  uint8_t          count;    /* was A */
  uint8_t          iters;    /* was B */

  assert(state != NULL);

  wipe_visible_tiles(state);

  assert(state->room_index < room__LIMIT);
  room_index = state->room_index; /* local cached copy */
  offset     = 0;

  setup_doors(state);

  state->roomdef_dimensions_index = get_roomdef(state, room_index, offset++);

  /* Copy boundaries into state. */
  state->roomdef_object_bounds_count = count = get_roomdef(state, room_index, offset); /* count of boundaries */
  assert(count <= MAX_ROOMDEF_OBJECT_BOUNDS);
  pbounds = &state->roomdef_object_bounds[0]; /* Conv: Moved */
  if (count == 0) /* no boundaries */
  {
    offset++; /* skip to interior mask */
  }
  else
  {
    uint8_t     *p; /* so we can access bounds as bytes */
    unsigned int c; /* */

    offset++; /* Conv: Don't re-copy already copied count byte. */
    p = &pbounds->x0;
    for (c = 0; c < count * sizeof(bounds_t); c++)
      *p++ = get_roomdef(state, room_index, offset++);
    /* arrive at interior mask */
  }

  /* Copy interior mask into state->interior_mask_data. */
  state->interior_mask_data_count = iters = get_roomdef(state, room_index, offset++); /* count of interior masks */
  assert(iters <= MAX_INTERIOR_MASK_REFS);
  pmask = &state->interior_mask_data[0]; /* Conv: Moved */
  while (iters--)
  {
    uint8_t index;

    index = get_roomdef(state, room_index, offset++);
    /* Conv: Structures were changed from 7 to 8 bytes wide. */
    memcpy(pmask, &interior_mask_data_source[index], sizeof(*pmask));
    pmask++;
  }

  /* Plot all objects (as tiles). */
  iters = get_roomdef(state, room_index, offset++); /* Count of objects */
  while (iters--)
  {
    uint8_t object_index;
    uint8_t column;
    uint8_t row;

    object_index = get_roomdef(state, room_index, offset++);
    column       = get_roomdef(state, room_index, offset++);
    row          = get_roomdef(state, room_index, offset++);

    expand_object(state, object_index, &state->tile_buf[row * state->columns + column]);
  }
}